

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc_cord_state.cc
# Opt level: O0

PrefixCrc __thiscall
absl::lts_20250127::crc_internal::CrcCordState::NormalizedPrefixCrcAtNthChunk
          (CrcCordState *this,size_t n)

{
  bool bVar1;
  crc32c_t cVar2;
  size_t sVar3;
  Rep *pRVar4;
  const_reference pvVar5;
  PrefixCrc PVar6;
  size_t length;
  size_t n_local;
  CrcCordState *this_local;
  crc32c_t local_10;
  
  sVar3 = NumChunks(this);
  if (n < sVar3) {
    bVar1 = IsNormalized(this);
    if (bVar1) {
      pRVar4 = rep(this);
      pvVar5 = std::
               deque<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
               ::operator[](&pRVar4->prefix_crc,n);
      this_local = (CrcCordState *)pvVar5->length;
      local_10.crc_ = (uint32_t)*(undefined8 *)&pvVar5->crc;
    }
    else {
      pRVar4 = rep(this);
      pvVar5 = std::
               deque<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
               ::operator[](&pRVar4->prefix_crc,n);
      sVar3 = pvVar5->length;
      pRVar4 = rep(this);
      sVar3 = sVar3 - (pRVar4->removed_prefix).length;
      pRVar4 = rep(this);
      cVar2.crc_ = (pRVar4->removed_prefix).crc.crc_;
      pRVar4 = rep(this);
      pvVar5 = std::
               deque<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
               ::operator[](&pRVar4->prefix_crc,n);
      cVar2 = RemoveCrc32cPrefix(cVar2,(pvVar5->crc).crc_,sVar3);
      PrefixCrc::PrefixCrc((PrefixCrc *)&this_local,sVar3,cVar2);
    }
    PVar6.crc.crc_ = local_10.crc_;
    PVar6.length = (size_t)this_local;
    PVar6._12_4_ = 0;
    return PVar6;
  }
  __assert_fail("n < NumChunks()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/crc/internal/crc_cord_state.cc"
                ,0x58,
                "CrcCordState::PrefixCrc absl::crc_internal::CrcCordState::NormalizedPrefixCrcAtNthChunk(size_t) const"
               );
}

Assistant:

CrcCordState::PrefixCrc CrcCordState::NormalizedPrefixCrcAtNthChunk(
    size_t n) const {
  assert(n < NumChunks());
  if (IsNormalized()) {
    return rep().prefix_crc[n];
  }
  size_t length = rep().prefix_crc[n].length - rep().removed_prefix.length;
  return PrefixCrc(length,
                   absl::RemoveCrc32cPrefix(rep().removed_prefix.crc,
                                            rep().prefix_crc[n].crc, length));
}